

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

int __thiscall
vkt::memory::anon_unknown_0::BufferCopyToImage::verify
          (BufferCopyToImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  undefined8 *puVar1;
  byte bVar2;
  InstanceInterface *vki;
  DeviceInterface *vkd;
  VkDevice device;
  undefined8 uVar3;
  VkResult VVar4;
  uint uVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  VkBufferMemoryBarrier bufferBarrier;
  long *local_3c8;
  undefined8 local_3c0;
  long local_3b8;
  undefined8 uStack_3b0;
  long *local_3a8;
  undefined8 local_3a0;
  long local_398;
  undefined8 uStack_390;
  VkCommandBuffer local_388;
  long *plStack_380;
  VkAccessFlags local_378;
  VkAccessFlags VStack_374;
  VkImageLayout VStack_370;
  VkImageLayout VStack_36c;
  EVP_PKEY_CTX *local_360;
  ulong *local_358;
  long local_350;
  ulong local_348;
  long lStack_340;
  ulong *local_338;
  long local_330;
  ulong local_328;
  long lStack_320;
  ulong *local_318;
  long lStack_310;
  ulong local_308;
  long lStack_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  deInt32 local_2ec;
  deInt32 local_2e8;
  undefined4 local_2e4;
  Hex<8UL> local_2e0;
  long local_2d8;
  ulong local_2d0 [2];
  Hex<8UL> local_2c0;
  long local_2b8;
  ulong local_2b0 [2];
  long *local_2a0;
  long local_298;
  long local_290;
  undefined4 uStack_288;
  undefined4 uStack_284;
  ulong *local_280;
  long local_278;
  ulong local_270 [2];
  long *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_240;
  VkDeviceMemory local_228;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_220;
  VkBuffer local_208;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_200;
  ResultCollector *local_1e8;
  uchar *local_1e0;
  VkQueue local_1d8;
  VkPhysicalDevice local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  VkImageMemoryBarrier imageBarrier;
  ios_base local_138 [264];
  
  local_1e8 = *(ResultCollector **)(ctx + 8);
  puVar7 = *(undefined8 **)(ctx + 0x10);
  vki = (InstanceInterface *)*puVar7;
  vkd = (DeviceInterface *)puVar7[1];
  local_1d0 = (VkPhysicalDevice)puVar7[2];
  device = (VkDevice)puVar7[3];
  local_1d8 = (VkQueue)puVar7[4];
  local_1e0 = sig;
  createBeginCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&imageBarrier,vkd,device,(VkCommandPool)puVar7[9],
             (VkCommandBufferLevel)tbs);
  local_378 = imageBarrier.srcAccessMask;
  VStack_374 = imageBarrier.dstAccessMask;
  VStack_370 = imageBarrier.oldLayout;
  VStack_36c = imageBarrier.newLayout;
  local_388 = (VkCommandBuffer)imageBarrier._0_8_;
  plStack_380 = (long *)imageBarrier.pNext;
  local_360 = ctx;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_240,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*(long *)(ctx + 0x10) + 0x70));
  imageBarrier._24_8_ = SEXT48(this->m_imageWidth * this->m_imageHeight * 4);
  imageBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  imageBarrier.pNext = (void *)0x0;
  imageBarrier._16_8_ = imageBarrier._16_8_ & 0xffffffff00000000;
  imageBarrier.srcQueueFamilyIndex = 2;
  imageBarrier.dstQueueFamilyIndex = 0;
  imageBarrier.image.m_internal._0_4_ =
       (int)((ulong)((long)local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  imageBarrier.subresourceRange._0_8_ =
       local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&bufferBarrier,vkd,device,
                     (VkBufferCreateInfo *)&imageBarrier,(VkAllocationCallbacks *)0x0);
  local_208.m_internal = bufferBarrier._0_8_;
  DStack_200.m_deviceIface = (DeviceInterface *)bufferBarrier.pNext;
  DStack_200.m_device = (VkDevice)bufferBarrier._16_8_;
  DStack_200.m_allocator = (VkAllocationCallbacks *)bufferBarrier._24_8_;
  bindBufferMemory((Move<vk::Handle<(vk::HandleType)7>_> *)&imageBarrier,vki,vkd,local_1d0,device,
                   (VkBuffer)bufferBarrier._0_8_,bufferBarrier.sType);
  DStack_220.m_device = (VkDevice)imageBarrier._16_8_;
  DStack_220.m_allocator = (VkAllocationCallbacks *)imageBarrier._24_8_;
  local_228.m_internal = imageBarrier._0_8_;
  DStack_220.m_deviceIface = (DeviceInterface *)imageBarrier.pNext;
  imageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageBarrier.pNext = (void *)0x0;
  imageBarrier.srcAccessMask = 0x1000;
  imageBarrier.dstAccessMask = 0x800;
  imageBarrier.oldLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  imageBarrier.newLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
  imageBarrier.srcQueueFamilyIndex = 0xffffffff;
  imageBarrier.dstQueueFamilyIndex = 0xffffffff;
  imageBarrier.image.m_internal =
       (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  imageBarrier.subresourceRange.aspectMask = 1;
  imageBarrier.subresourceRange.baseMipLevel = 0;
  imageBarrier.subresourceRange.levelCount = 1;
  imageBarrier.subresourceRange.baseArrayLayer = 0;
  imageBarrier.subresourceRange.layerCount = 1;
  bufferBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  bufferBarrier.pNext = (void *)0x0;
  bufferBarrier.srcAccessMask = 0x1000;
  bufferBarrier.dstAccessMask = 0x2000;
  bufferBarrier.srcQueueFamilyIndex = 0xffffffff;
  bufferBarrier.dstQueueFamilyIndex = 0xffffffff;
  bufferBarrier.buffer.m_internal = local_208.m_internal;
  bufferBarrier.offset = 0;
  bufferBarrier.size = 0xffffffffffffffff;
  local_318 = (ulong *)0x0;
  lStack_310 = 0;
  local_308 = 1;
  lStack_300 = 0x100000000;
  local_2f8 = 0;
  local_2f0 = 0;
  local_2ec = this->m_imageWidth;
  local_2e8 = this->m_imageHeight;
  local_2e4 = 1;
  (*vkd->_vptr_DeviceInterface[0x6d])(vkd,local_388,0x1000,0x1000,0,0,0,0,0,1,&imageBarrier);
  (*vkd->_vptr_DeviceInterface[99])
            (vkd,local_388,
             (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,local_208.m_internal,1,&local_318);
  (*vkd->_vptr_DeviceInterface[0x6d])(vkd,local_388,0x1000,0x4000,0,0,0,1,&bufferBarrier,0,0);
  VVar4 = (*vkd->_vptr_DeviceInterface[0x4a])(vkd,local_388);
  ::vk::checkResult(VVar4,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0xa77);
  queueRun(vkd,local_1d8,local_388);
  VVar4 = (*vkd->_vptr_DeviceInterface[7])
                    (vkd,device,local_228.m_internal,0,
                     (long)(this->m_imageWidth * this->m_imageHeight * 4),0,&imageBarrier);
  ::vk::checkResult(VVar4,"vkd.mapMemory(device, memory, 0, size, 0, &ptr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x2b3);
  uVar3 = imageBarrier._0_8_;
  ::vk::invalidateMappedMemoryRange
            (vkd,device,local_228,0,(long)(this->m_imageWidth * this->m_imageHeight * 4));
  uVar5 = this->m_imageWidth * this->m_imageHeight;
  if ((uVar5 & 0x3fffffff) != 0) {
    uVar11 = 0;
    do {
      if (((*(ulong *)(*(long *)(local_360 + 0x30) + (uVar11 >> 6) * 8) >> (uVar11 & 0x3f) & 1) != 0
          ) && (*(char *)(uVar3 + uVar11) != *(char *)(*(long *)(local_360 + 0x18) + uVar11))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&imageBarrier);
        std::ostream::_M_insert<unsigned_long>((ulong)&imageBarrier);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&imageBarrier);
        std::ios_base::~ios_base(local_138);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_1c8);
        local_2a0 = &local_290;
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_290 = *plVar8;
          uStack_288 = (undefined4)plVar6[3];
          uStack_284 = *(undefined4 *)((long)plVar6 + 0x1c);
        }
        else {
          local_290 = *plVar8;
          local_2a0 = (long *)*plVar6;
        }
        local_298 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        (*(this->super_CmdCommand)._vptr_CmdCommand[2])(this);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_260 = &local_250;
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_250 = *plVar8;
          lStack_248 = plVar6[3];
        }
        else {
          local_250 = *plVar8;
          local_260 = (long *)*plVar6;
        }
        local_258 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_260);
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_348 = *puVar9;
          lStack_340 = plVar6[3];
          local_358 = &local_348;
        }
        else {
          local_348 = *puVar9;
          local_358 = (ulong *)*plVar6;
        }
        local_350 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        bVar2 = *(byte *)(*(long *)(local_360 + 0x18) + uVar11);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&imageBarrier);
        local_2c0.value = (deUint64)(ulong)bVar2;
        tcu::Format::Hex<8UL>::toStream(&local_2c0,(ostream *)&imageBarrier);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&imageBarrier);
        std::ios_base::~ios_base(local_138);
        uVar10 = 0xf;
        if (local_358 != &local_348) {
          uVar10 = local_348;
        }
        if (uVar10 < (ulong)(local_278 + local_350)) {
          uVar10 = 0xf;
          if (local_280 != local_270) {
            uVar10 = local_270[0];
          }
          if (uVar10 < (ulong)(local_278 + local_350)) goto LAB_00699a3f;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_358);
        }
        else {
LAB_00699a3f:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_358,(ulong)local_280);
        }
        local_3c8 = &local_3b8;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_3b8 = *plVar6;
          uStack_3b0 = puVar7[3];
        }
        else {
          local_3b8 = *plVar6;
          local_3c8 = (long *)*puVar7;
        }
        local_3c0 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)plVar6 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_3c8);
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_328 = *puVar9;
          lStack_320 = plVar6[3];
          local_338 = &local_328;
        }
        else {
          local_328 = *puVar9;
          local_338 = (ulong *)*plVar6;
        }
        local_330 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        bVar2 = *(byte *)(uVar3 + uVar11);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&imageBarrier);
        local_2e0.value = (deUint64)(ulong)bVar2;
        tcu::Format::Hex<8UL>::toStream(&local_2e0,(ostream *)&imageBarrier);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&imageBarrier);
        std::ios_base::~ios_base(local_138);
        uVar11 = 0xf;
        if (local_338 != &local_328) {
          uVar11 = local_328;
        }
        if (uVar11 < (ulong)(local_2b8 + local_330)) {
          uVar11 = 0xf;
          if ((ulong *)local_2c0.value != local_2b0) {
            uVar11 = local_2b0[0];
          }
          if (uVar11 < (ulong)(local_2b8 + local_330)) goto LAB_00699bc5;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_338);
        }
        else {
LAB_00699bc5:
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_338,local_2c0.value)
          ;
        }
        local_3a8 = &local_398;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_398 = *plVar6;
          uStack_390 = puVar7[3];
        }
        else {
          local_398 = *plVar6;
          local_3a8 = (long *)*puVar7;
        }
        local_3a0 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)plVar6 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_3a8);
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_308 = *puVar9;
          lStack_300 = plVar6[3];
          local_318 = &local_308;
        }
        else {
          local_308 = *puVar9;
          local_318 = (ulong *)*plVar6;
        }
        lStack_310 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&imageBarrier);
        std::ostream::_M_insert<unsigned_long>((ulong)&imageBarrier);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&imageBarrier);
        std::ios_base::~ios_base(local_138);
        uVar11 = 0xf;
        if (local_318 != &local_308) {
          uVar11 = local_308;
        }
        if (uVar11 < (ulong)(local_2d8 + lStack_310)) {
          uVar11 = 0xf;
          if ((ulong *)local_2e0.value != local_2d0) {
            uVar11 = local_2d0[0];
          }
          if (uVar11 < (ulong)(local_2d8 + lStack_310)) goto LAB_00699d3d;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,(ulong)local_318);
        }
        else {
LAB_00699d3d:
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_318,local_2e0.value)
          ;
        }
        bufferBarrier._0_8_ = &bufferBarrier.srcAccessMask;
        puVar1 = puVar7 + 2;
        if ((undefined8 *)*puVar7 == puVar1) {
          bufferBarrier._16_8_ = *puVar1;
          bufferBarrier._24_8_ = puVar7[3];
        }
        else {
          bufferBarrier._16_8_ = *puVar1;
          bufferBarrier._0_8_ = (undefined8 *)*puVar7;
        }
        bufferBarrier.pNext = (void *)puVar7[1];
        *puVar7 = puVar1;
        puVar7[1] = 0;
        *(undefined1 *)puVar1 = 0;
        tcu::ResultCollector::fail(local_1e8,(string *)&bufferBarrier);
        if ((VkAccessFlags *)bufferBarrier._0_8_ != &bufferBarrier.srcAccessMask) {
          operator_delete((void *)bufferBarrier._0_8_,bufferBarrier._16_8_ + 1);
        }
        if ((ulong *)local_2e0.value != local_2d0) {
          operator_delete((void *)local_2e0.value,local_2d0[0] + 1);
        }
        if (local_318 != &local_308) {
          operator_delete(local_318,local_308 + 1);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8,local_398 + 1);
        }
        if ((ulong *)local_2c0.value != local_2b0) {
          operator_delete((void *)local_2c0.value,local_2b0[0] + 1);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338,local_328 + 1);
        }
        if (local_3c8 != &local_3b8) {
          operator_delete(local_3c8,local_3b8 + 1);
        }
        if (local_280 != local_270) {
          operator_delete(local_280,local_270[0] + 1);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348 + 1);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260,local_250 + 1);
        }
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,local_290 + 1);
        }
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],local_1b8[0] + 1);
        }
        break;
      }
      uVar11 = uVar11 + 1;
    } while ((long)(int)(uVar5 * 4) != uVar11);
  }
  (*vkd->_vptr_DeviceInterface[8])(vkd,device,local_228.m_internal);
  if (local_228.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()(&DStack_220,local_228);
  }
  if (local_208.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_200,local_208);
  }
  if (local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_388 != (VkCommandBuffer)0x0) {
    imageBarrier._0_8_ = local_388;
    local_388 = (VkCommandBuffer)
                (**(code **)(*plStack_380 + 0x240))(plStack_380,_local_378,_VStack_370,1);
  }
  return (int)local_388;
}

Assistant:

void BufferCopyToImage::verify (VerifyContext& context, size_t commandIndex)
{
	tcu::ResultCollector&					resultCollector	(context.getResultCollector());
	ReferenceMemory&						reference		(context.getReference());
	const vk::InstanceInterface&			vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&				vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice				physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice						device			= context.getContext().getDevice();
	const vk::VkQueue						queue			= context.getContext().getQueue();
	const vk::VkCommandPool					commandPool		= context.getContext().getCommandPool();
	const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const vector<deUint32>&					queueFamilies	= context.getContext().getQueueFamilies();
	const vk::Unique<vk::VkBuffer>			dstBuffer		(createBuffer(vkd, device, 4 * m_imageWidth * m_imageHeight, vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies));
	const vk::Unique<vk::VkDeviceMemory>	memory			(bindBufferMemory(vki, vkd, physicalDevice, device, *dstBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT));
	{
		const vk::VkImageMemoryBarrier		imageBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			vk::VK_ACCESS_TRANSFER_WRITE_BIT,
			vk::VK_ACCESS_TRANSFER_READ_BIT,

			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_dstImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};
		const vk::VkBufferMemoryBarrier bufferBarrier =
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
			DE_NULL,

			vk::VK_ACCESS_TRANSFER_WRITE_BIT,
			vk::VK_ACCESS_HOST_READ_BIT,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,
			*dstBuffer,
			0,
			VK_WHOLE_SIZE
		};

		const vk::VkBufferImageCopy	region =
		{
			0,
			0, 0,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// mipLevel
				0,	// arrayLayer
				1	// layerCount
			},
			{ 0, 0, 0 },
			{
				(deUint32)m_imageWidth,
				(deUint32)m_imageHeight,
				1u
			}
		};

		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &imageBarrier);
		vkd.cmdCopyImageToBuffer(*commandBuffer, *m_dstImage, vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *dstBuffer, 1, &region);
		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 1, &bufferBarrier, 0, (const vk::VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
	queueRun(vkd, queue, *commandBuffer);

	{
		void* const	ptr		= mapMemory(vkd, device, *memory, 4 * m_imageWidth * m_imageHeight);

		vk::invalidateMappedMemoryRange(vkd, device, *memory, 0,  4 * m_imageWidth * m_imageHeight);

		{
			const deUint8* const	data = (const deUint8*)ptr;

			for (size_t pos = 0; pos < (size_t)( 4 * m_imageWidth * m_imageHeight); pos++)
			{
				if (reference.isDefined(pos))
				{
					if (data[pos] != reference.get(pos))
					{
						resultCollector.fail(
								de::toString(commandIndex) + ":" + getName()
								+ " Result differs from reference, Expected: "
								+ de::toString(tcu::toHex<8>(reference.get(pos)))
								+ ", Got: "
								+ de::toString(tcu::toHex<8>(data[pos]))
								+ ", At offset: "
								+ de::toString(pos));
						break;
					}
				}
			}
		}

		vkd.unmapMemory(device, *memory);
	}
}